

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

int atomuse(stmt *s)

{
  uint uVar1;
  int local_34;
  int local_30;
  int local_2c;
  int c;
  stmt *s_local;
  
  uVar1 = s->code;
  if (uVar1 == 0xffffffff) {
    s_local._4_4_ = -1;
  }
  else {
    switch(uVar1 & 7) {
    case 0:
    case 1:
      if ((uVar1 & 0xe0) == 0x40) {
        local_30 = 0x11;
      }
      else {
        if ((uVar1 & 0xe0) == 0x60) {
          local_34 = s->k;
        }
        else {
          local_34 = -1;
        }
        local_30 = local_34;
      }
      s_local._4_4_ = local_30;
      break;
    case 2:
      s_local._4_4_ = 0x10;
      break;
    case 3:
      s_local._4_4_ = 0x11;
      break;
    case 4:
    case 5:
      if ((uVar1 & 8) == 8) {
        s_local._4_4_ = 0x12;
      }
      else {
        s_local._4_4_ = 0x10;
      }
      break;
    case 6:
      if ((uVar1 & 0x18) == 0x10) {
        local_2c = 0x10;
      }
      else {
        local_2c = -1;
        if ((uVar1 & 0x18) == 8) {
          local_2c = 0x11;
        }
      }
      s_local._4_4_ = local_2c;
      break;
    case 7:
      s_local._4_4_ = 0x10;
      if ((uVar1 & 0xf8) == 0x80) {
        s_local._4_4_ = 0x11;
      }
      break;
    default:
      abort();
    }
  }
  return s_local._4_4_;
}

Assistant:

static int
atomuse(struct stmt *s)
{
	register int c = s->code;

	if (c == NOP)
		return -1;

	switch (BPF_CLASS(c)) {

	case BPF_RET:
		return (BPF_RVAL(c) == BPF_A) ? A_ATOM :
			(BPF_RVAL(c) == BPF_X) ? X_ATOM : -1;

	case BPF_LD:
	case BPF_LDX:
		return (BPF_MODE(c) == BPF_IND) ? X_ATOM :
			(BPF_MODE(c) == BPF_MEM) ? s->k : -1;

	case BPF_ST:
		return A_ATOM;

	case BPF_STX:
		return X_ATOM;

	case BPF_JMP:
	case BPF_ALU:
		if (BPF_SRC(c) == BPF_X)
			return AX_ATOM;
		return A_ATOM;

	case BPF_MISC:
		return BPF_MISCOP(c) == BPF_TXA ? X_ATOM : A_ATOM;
	}
	abort();
	/* NOTREACHED */
}